

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void tcp_recv_cb(ev_loop *loop,ev_io *w,int revents)

{
  ushort uVar1;
  in_addr_t iVar2;
  uint uVar3;
  ssize_t sVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char local_2048 [8];
  char buffer [8192];
  sockaddr_in saddr;
  
  sVar4 = recv(w[-1].fd,local_2048,0x5e8,0);
  if ((int)sVar4 < 1) {
    remove_relay_ctx(loop,(relay_ctx_t *)&w[-1].fd);
  }
  else {
    ev_timer_again(loop,(ev_timer *)(w + 2));
    ezbuf_put(*(ezbuf_t **)(w + 3),local_2048,(int)sVar4);
    uVar1 = *(ushort *)(*(long *)&w[4].fd + 0x44);
    uVar1 = uVar1 << 8 | uVar1 >> 8;
    buffer[0x1ffa] = (char)uVar1;
    buffer[0x1ffb] = (char)(uVar1 >> 8);
    buffer[0x1ff8] = '\x02';
    buffer[0x1ff9] = '\0';
    buffer[0x1ffc] = '\0';
    buffer[0x1ffd] = '\0';
    buffer[0x1ffe] = '\0';
    buffer[0x1fff] = '\0';
    iVar2 = inet_addr((char *)(*(long *)&w[4].fd + 0x20));
    buffer[0x1ffc] = (char)iVar2;
    buffer[0x1ffd] = (char)(iVar2 >> 8);
    buffer[0x1ffe] = (char)(iVar2 >> 0x10);
    buffer[0x1fff] = (char)(iVar2 >> 0x18);
    sVar5 = ezbuf_size(*(ezbuf_t **)(w + 3));
    if (0x5e7 < sVar5) {
      sVar5 = 0x5e8;
      do {
        sVar5 = ezbuf_get(*(ezbuf_t **)(w + 3),local_2048,(int)sVar5);
        uVar3 = unpack(local_2048,(int)sVar5,local_2048);
        pcVar6 = inet_ntoa((in_addr)*(in_addr_t *)((long)&w[3].data + 4));
        vlog("[tcp] recv(%d) from %s:%d\n",(ulong)uVar3,pcVar6);
        sendto(*(int *)((long)&w[3].next + 4),local_2048,(long)(int)uVar3,0,
               (sockaddr *)(buffer + 0x1ff8),0x10);
        sVar7 = ezbuf_size(*(ezbuf_t **)(w + 3));
      } while ((ulong)(long)(int)sVar5 <= sVar7);
    }
  }
  return;
}

Assistant:

static void tcp_recv_cb(EV_P_ ev_io *w, int revents)
{
    int rx, bsize;
    char buffer[EZBUF_MAX];
    struct sockaddr_in saddr;
    socklen_t saddr_len;

    relay_ctx_t *relay_ctx;
    relay_ctx = obj_entry(w, relay_ctx_t, recv_io);

    bsize = sizeof(package_t);

    rx = recv(relay_ctx->tcp_fd, buffer, bsize, 0);
    if (rx <= 0)
    {
        remove_relay_ctx(EV_A, relay_ctx);
        return;
    }

    ev_timer_again(EV_A_ &relay_ctx->timeout);

    ezbuf_put(relay_ctx->recv_buf, buffer, rx);

    memset(&saddr, 0, sizeof(saddr));
    saddr.sin_family = AF_INET;
    saddr.sin_port = htons(relay_ctx->cfg->serv_port);;
    saddr.sin_addr.s_addr = inet_addr(relay_ctx->cfg->serv_addr);
    saddr_len = sizeof(saddr);

    while(1){
        if (ezbuf_size(relay_ctx->recv_buf) < bsize)
            break;

        bsize = ezbuf_get(relay_ctx->recv_buf, buffer, bsize);
        rx = unpack(buffer, bsize, buffer);
        vlog("[tcp] recv(%d) from %s:%d\n", rx, inet_ntoa(relay_ctx->src_addr.sin_addr), ntohs(relay_ctx->src_addr.sin_port));

        sendto(
            relay_ctx->udp_fd,
            buffer,
            rx,
            0,
            (struct sockaddr *)&saddr,
            saddr_len
        );
    }
}